

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31fDrawBuffersIndexedTests.cpp
# Opt level: O2

void __thiscall
deqp::gles31::Functional::anon_unknown_0::FragmentShader::shadeFragments
          (FragmentShader *this,FragmentPacket *packets,int numPackets,
          FragmentShadingContext *context)

{
  deUint32 dVar1;
  deUint32 dVar2;
  deUint32 dVar3;
  float fVar4;
  float fVar5;
  float fVar6;
  int iVar7;
  GenericVec4 *pGVar8;
  TextureChannelClass TVar9;
  int iVar10;
  int fragNdx;
  int fragNdx_00;
  FragmentPacket *packet;
  uint uVar11;
  uint uVar12;
  uint uVar13;
  uint uVar14;
  VecAccess<float,_4,_2> local_78;
  ulong local_68;
  FragmentPacket *local_60;
  ulong local_58;
  ulong local_50;
  Vec2 vColor;
  rr local_40 [16];
  
  local_68 = 0;
  local_58 = (ulong)(uint)numPackets;
  if (numPackets < 1) {
    local_58 = 0;
  }
  local_60 = packets;
  for (local_50 = 0; local_50 != local_58; local_50 = local_50 + 1) {
    packet = local_60 + local_50;
    for (fragNdx_00 = 0; fragNdx_00 != 4; fragNdx_00 = fragNdx_00 + 1) {
      rr::readVarying<float>(local_40,packet,context,0,fragNdx_00);
      local_78.m_index[0] = 0;
      local_78.m_index[1] = 1;
      local_78.m_vector = (Vector<float,_4> *)local_40;
      tcu::VecAccess::operator_cast_to_Vector(&local_78);
      local_78.m_index[1] = (int)(1.0 - vColor.m_data[1]);
      local_78.m_index[0] = (int)(1.0 - vColor.m_data[0]);
      local_78.m_vector = (Vector<float,_4> *)vColor.m_data;
      TVar9 = tcu::getTextureChannelClass((this->m_info).m_format.type);
      iVar10 = (int)local_68;
      switch(TVar9) {
      case TEXTURECHANNELCLASS_SIGNED_FIXED_POINT:
      case TEXTURECHANNELCLASS_UNSIGNED_FIXED_POINT:
      case TEXTURECHANNELCLASS_FLOATING_POINT:
        iVar7 = this->m_drawBufferNdx;
        dVar1 = local_78.m_index[(long)((iVar7 + 1) % 4) + -2];
        dVar2 = local_78.m_index[(long)((iVar7 + 2) % 4) + -2];
        dVar3 = local_78.m_index[(long)((iVar7 + 3) % 4) + -2];
        pGVar8 = context->outputArray;
        iVar10 = (iVar10 + fragNdx_00) * context->numFragmentOutputs;
        pGVar8[iVar10].v.uData[0] = local_78.m_index[(long)(iVar7 % 4) + -2];
        pGVar8[iVar10].v.uData[1] = dVar1;
        pGVar8[iVar10].v.uData[2] = dVar2;
        pGVar8[iVar10].v.uData[3] = dVar3;
        break;
      case TEXTURECHANNELCLASS_SIGNED_INTEGER:
        iVar7 = this->m_drawBufferNdx;
        fVar4 = (float)local_78.m_index[(long)((iVar7 + 3) % 4) + -2];
        fVar5 = (float)local_78.m_index[(long)((iVar7 + 2) % 4) + -2];
        fVar6 = (float)local_78.m_index[(long)((iVar7 + 1) % 4) + -2];
        pGVar8 = context->outputArray + (iVar10 + fragNdx_00) * context->numFragmentOutputs;
        (pGVar8->v).uData[0] = (int)(float)local_78.m_index[(long)(iVar7 % 4) + -2];
        (pGVar8->v).uData[1] = (int)fVar6;
        (pGVar8->v).uData[2] = (int)fVar5;
        (pGVar8->v).uData[3] = (int)fVar4;
        break;
      case TEXTURECHANNELCLASS_UNSIGNED_INTEGER:
        iVar7 = this->m_drawBufferNdx;
        fVar4 = (float)local_78.m_index[(long)((iVar7 + 3) % 4) + -2];
        fVar5 = (float)local_78.m_index[(long)((iVar7 + 2) % 4) + -2];
        fVar6 = (float)local_78.m_index[(long)((iVar7 + 1) % 4) + -2];
        uVar11 = (uint)(float)local_78.m_index[(long)(iVar7 % 4) + -2];
        uVar12 = (uint)fVar6;
        uVar13 = (uint)fVar5;
        uVar14 = (uint)fVar4;
        pGVar8 = context->outputArray + (iVar10 + fragNdx_00) * context->numFragmentOutputs;
        (pGVar8->v).uData[0] =
             (int)((float)local_78.m_index[(long)(iVar7 % 4) + -2] - 2.1474836e+09) &
             (int)uVar11 >> 0x1f | uVar11;
        (pGVar8->v).uData[1] = (int)(fVar6 - 2.1474836e+09) & (int)uVar12 >> 0x1f | uVar12;
        (pGVar8->v).uData[2] = (int)(fVar5 - 2.1474836e+09) & (int)uVar13 >> 0x1f | uVar13;
        (pGVar8->v).uData[3] = (int)(fVar4 - 2.1474836e+09) & (int)uVar14 >> 0x1f | uVar14;
      }
    }
    local_68 = (ulong)((int)local_68 + 4);
  }
  return;
}

Assistant:

void FragmentShader::shadeFragments (rr::FragmentPacket* packets, const int numPackets, const rr::FragmentShadingContext& context) const
{
	for (int packetNdx = 0; packetNdx < numPackets; ++packetNdx)
	{
		rr::FragmentPacket& packet = packets[packetNdx];

		DE_ASSERT(m_drawBufferNdx >= 0);
		DE_UNREF(m_info);

		for (int fragNdx = 0; fragNdx < 4; ++fragNdx)
		{
			const Vec2	vColor		= rr::readVarying<float>(packet, context, 0, fragNdx).xy();
			const float	values[]	=
			{
				vColor.x(),
				vColor.y(),
				(1.0f - vColor.x()),
				(1.0f - vColor.y())
			};

			switch (tcu::getTextureChannelClass(m_info.getFormat().type))
			{
				case tcu::TEXTURECHANNELCLASS_FLOATING_POINT:
				case tcu::TEXTURECHANNELCLASS_SIGNED_FIXED_POINT:
				case tcu::TEXTURECHANNELCLASS_UNSIGNED_FIXED_POINT:
				{
					const Vec4 color (values[(m_drawBufferNdx + 0) % 4],
									  values[(m_drawBufferNdx + 1) % 4],
									  values[(m_drawBufferNdx + 2) % 4],
									  values[(m_drawBufferNdx + 3) % 4]);

					rr::writeFragmentOutput(context, packetNdx, fragNdx, 0, color);
					break;
				}

				case tcu::TEXTURECHANNELCLASS_UNSIGNED_INTEGER:
				{
					const UVec4 color ((deUint32)(values[(m_drawBufferNdx + 0) % 4]),
									   (deUint32)(values[(m_drawBufferNdx + 1) % 4]),
									   (deUint32)(values[(m_drawBufferNdx + 2) % 4]),
									   (deUint32)(values[(m_drawBufferNdx + 3) % 4]));

					rr::writeFragmentOutput(context, packetNdx, fragNdx, 0, color);
					break;
				}

				case tcu::TEXTURECHANNELCLASS_SIGNED_INTEGER:
				{
					const IVec4 color ((deInt32)(values[(m_drawBufferNdx + 0) % 4]),
									   (deInt32)(values[(m_drawBufferNdx + 1) % 4]),
									   (deInt32)(values[(m_drawBufferNdx + 2) % 4]),
									   (deInt32)(values[(m_drawBufferNdx + 3) % 4]));

					rr::writeFragmentOutput(context, packetNdx, fragNdx, 0, color);
					break;
				}

				default:
					DE_ASSERT(DE_FALSE);
			};
		}
	}
}